

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Problem.hpp
# Opt level: O0

void __thiscall Kernel::Problem::reportEqualityEliminated(Problem *this)

{
  Problem *in_RDI;
  MaybeBool local_c [3];
  
  invalidateProperty(in_RDI);
  Lib::MaybeBool::MaybeBool(local_c,false);
  (in_RDI->_hasEquality)._value = local_c[0]._value;
  in_RDI->_mayHaveEquality = false;
  in_RDI->_mayHaveFunctionDefinitions = false;
  in_RDI->_mayHaveInequalityResolvableWithDeletion = false;
  in_RDI->_mayHaveXEqualsY = false;
  return;
}

Assistant:

void reportEqualityEliminated()
  {
    invalidateProperty();
    _hasEquality = false;
    _mayHaveEquality = false;
    _mayHaveFunctionDefinitions = false;
    _mayHaveInequalityResolvableWithDeletion = false;
    _mayHaveXEqualsY = false;
  }